

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

MapinfoSpawnItem * __thiscall
TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_>::Insert
          (TMap<int,_MapinfoSpawnItem,_THashTraits<int>,_TValueTraits<MapinfoSpawnItem>_> *this,
          int key,MapinfoSpawnItem *value)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar1 = this->Nodes + (this->Size - 1 & key);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key == key) {
      (pNVar2->Pair).Value.classname.Index = (value->classname).Index;
      FString::operator=(&(pNVar2->Pair).Value.filename,&value->filename);
LAB_0045c754:
      (pNVar2->Pair).Value.linenum = value->linenum;
      return &(pNVar2->Pair).Value;
    }
  }
  pNVar2 = NewKey(this,key);
  (pNVar2->Pair).Value.classname.Index = (value->classname).Index;
  FString::AttachToOther(&(pNVar2->Pair).Value.filename,&value->filename);
  goto LAB_0045c754;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}